

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::seedIdMap(TIntermediate *this,TIdMaps *idMaps,longlong *idShift)

{
  TIntermAggregate *pTVar1;
  undefined **local_b8;
  undefined1 local_b0;
  undefined7 local_af;
  undefined4 uStack_a8;
  TPoolAllocator *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  TIdMaps *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined7 local_6f;
  undefined4 uStack_68;
  TPoolAllocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  TIdMaps *local_40;
  ulong local_38;
  
  local_70 = 1;
  local_6f = 0;
  uStack_68 = 0;
  local_60 = GetThreadPoolAllocator();
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_78 = &PTR__TIntermTraverser_00923e30;
  local_38 = 0;
  local_40 = idMaps;
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&local_78);
  *idShift = local_38 & 0xffffffffffffff;
  local_b0 = 1;
  local_af = 0;
  uStack_a8 = 0;
  local_a0 = GetThreadPoolAllocator();
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  local_b8 = &PTR__TIntermTraverser_00923e98;
  local_80 = idMaps;
  pTVar1 = findLinkerObjects(this);
  (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[2])
            (pTVar1,&local_b8);
  return;
}

Assistant:

void TIntermediate::seedIdMap(TIdMaps& idMaps, long long& idShift)
{
    // all built-ins everywhere need to align on IDs and contribute to the max ID
    TBuiltInIdTraverser builtInIdTraverser(idMaps);
    treeRoot->traverse(&builtInIdTraverser);
    idShift = builtInIdTraverser.getIdShift() & TSymbolTable::uniqueIdMask;

    // user variables in the linker object list need to align on ids
    TUserIdTraverser userIdTraverser(idMaps);
    findLinkerObjects()->traverse(&userIdTraverser);
}